

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O2

bool __thiscall
ON_Plane::GetDistanceToBoundingBox(ON_Plane *this,ON_BoundingBox *Box,double *min,double *max)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_b0;
  ON_3dPoint P;
  ON_3dVector UnitNormal;
  ON_3dPoint local_48;
  
  UnitNormal.z = (this->zaxis).z;
  UnitNormal.x = (this->zaxis).x;
  UnitNormal.y = (this->zaxis).y;
  bVar2 = ON_3dVector::Unitize(&UnitNormal);
  if (bVar2) {
    ON_BoundingBox::Min(Box);
    ON_3dPoint::operator-((ON_3dVector *)&P,&local_48,&this->origin);
    dVar7 = ON_3dVector::operator*((ON_3dVector *)&P,&UnitNormal);
    local_b0 = dVar7;
    for (iVar4 = 0; iVar4 != 2; iVar4 = iVar4 + 1) {
      for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
        for (iVar6 = 0; iVar6 != 2; iVar6 = iVar6 + 1) {
          dVar9 = dVar7;
          dVar1 = local_b0;
          if ((iVar5 != 0 || iVar4 != 0) || iVar6 != 0) {
            if (iVar4 == 0) {
              ON_BoundingBox::Min(Box);
            }
            else {
              ON_BoundingBox::Max(Box);
            }
            pdVar3 = ON_3dPoint::operator[](&local_48,0);
            dVar1 = *pdVar3;
            pdVar3 = ON_3dPoint::operator[](&P,0);
            *pdVar3 = dVar1;
            if (iVar5 == 0) {
              ON_BoundingBox::Min(Box);
            }
            else {
              ON_BoundingBox::Max(Box);
            }
            pdVar3 = ON_3dPoint::operator[](&local_48,1);
            dVar1 = *pdVar3;
            pdVar3 = ON_3dPoint::operator[](&P,1);
            *pdVar3 = dVar1;
            if (iVar6 == 0) {
              ON_BoundingBox::Min(Box);
            }
            else {
              ON_BoundingBox::Max(Box);
            }
            pdVar3 = ON_3dPoint::operator[](&local_48,2);
            dVar1 = *pdVar3;
            pdVar3 = ON_3dPoint::operator[](&P,2);
            *pdVar3 = dVar1;
            ON_3dPoint::operator-((ON_3dVector *)&local_48,&P,&this->origin);
            dVar8 = ON_3dVector::operator*((ON_3dVector *)&local_48,&UnitNormal);
            dVar1 = dVar8;
            if ((local_b0 <= dVar8) && (dVar9 = dVar8, dVar1 = local_b0, dVar8 <= dVar7)) {
              dVar9 = dVar7;
            }
          }
          local_b0 = dVar1;
          dVar7 = dVar9;
        }
      }
    }
    *min = local_b0;
    *max = dVar7;
  }
  return bVar2;
}

Assistant:

bool ON_Plane::GetDistanceToBoundingBox(const ON_BoundingBox& Box,
				                                double* min, double* max) const
{
  //min and max signed distance.  Returns false if plane normal has zero length.

  ON_3dVector UnitNormal = Normal();
  if (!UnitNormal.Unitize()) 
    return false;

  double mind, maxd;
  mind = maxd = (Box.Min() - Origin())*UnitNormal;
  int i0, i1, i2;
  for (i0=0;i0<2;i0++)
  {
    for(i1=0;i1<2;i1++) 
    {
      for (i2=0;i2<2;i2++) 
      {
        if (i0||i1||i2) 
        {
          ON_3dPoint P;
          P[0]=(i0)?Box.Max()[0]:Box.Min()[0];
          P[1]=(i1)?Box.Max()[1]:Box.Min()[1];
          P[2]=(i2)?Box.Max()[2]:Box.Min()[2];
          double d = (P - Origin())*UnitNormal;
          //double dd = P.DistanceTo(ClosestPointTo(P));
          if (d < mind) 
            mind=d;
          else if (d > maxd) 
            maxd=d;
        }
      }
    }
  }
  *min = mind;
  *max = maxd;
  return true;
}